

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::HebrewCalendar::handleComputeMonthStart
          (HebrewCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  short sVar1;
  int year;
  UBool UVar2;
  int32_t iVar3;
  long lVar4;
  int local_2c;
  UErrorCode local_28;
  int32_t day;
  UErrorCode status;
  int32_t iStack_1c;
  UBool param_3_local;
  int32_t month_local;
  int32_t eyear_local;
  HebrewCalendar *this_local;
  
  local_28 = U_ZERO_ERROR;
  day._3_1_ = param_3;
  iStack_1c = eyear;
  _month_local = this;
  for (status = month; status < U_ZERO_ERROR; status = iVar3 + status) {
    iStack_1c = iStack_1c + -1;
    iVar3 = monthsInYear(iStack_1c);
  }
  for (; year = iStack_1c, U_ILLEGAL_CHAR_FOUND < status; status = status - iVar3) {
    iStack_1c = iStack_1c + 1;
    iVar3 = monthsInYear(year);
  }
  local_2c = startOfYear(iStack_1c,&local_28);
  UVar2 = ::U_FAILURE(local_28);
  if (UVar2 == '\0') {
    if (status != U_ZERO_ERROR) {
      UVar2 = isLeapYear(iStack_1c);
      if (UVar2 == '\0') {
        lVar4 = (long)status;
        iVar3 = yearType(this,iStack_1c);
        sVar1 = MONTH_START[lVar4][iVar3];
      }
      else {
        lVar4 = (long)status;
        iVar3 = yearType(this,iStack_1c);
        sVar1 = LEAP_MONTH_START[lVar4][iVar3];
      }
      local_2c = sVar1 + local_2c;
    }
    this_local._4_4_ = local_2c + 0x54f5d;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t HebrewCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /*useMonth*/) const {
    UErrorCode status = U_ZERO_ERROR;
    // Resolve out-of-range months.  This is necessary in order to
    // obtain the correct year.  We correct to
    // a 12- or 13-month year (add/subtract 12 or 13, depending
    // on the year) but since we _always_ number from 0..12, and
    // the leap year determines whether or not month 5 (Adar 1)
    // is present, we allow 0..12 in any given year.
    while (month < 0) {
        month += monthsInYear(--eyear);
    }
    // Careful: allow 0..12 in all years
    while (month > 12) {
        month -= monthsInYear(eyear++);
    }

    int32_t day = startOfYear(eyear, status);

    if(U_FAILURE(status)) {
        return 0;
    }

    if (month != 0) {
        if (isLeapYear(eyear)) {
            day += LEAP_MONTH_START[month][yearType(eyear)];
        } else {
            day += MONTH_START[month][yearType(eyear)];
        }
    }

    return (int) (day + 347997);
}